

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O0

RegressionLine * ZXing::QRCode::TraceLine(BitMatrix *image,PointF p,PointF d,int edge)

{
  double dVar1;
  PointT<double> d_00;
  PointT<double> p_00;
  PointI p_01;
  PointF p_02;
  PointT<int> p_03;
  PointT<int> p_04;
  PointT<double> p_05;
  bool bVar2;
  const_iterator pDVar3;
  vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> *__lhs;
  reference pPVar4;
  int in_EDX;
  undefined8 in_RSI;
  RegressionLine *in_RDI;
  BitMatrixCursor<ZXing::PointT<int>_> *this;
  PointT<double> PVar5;
  PointF PVar6;
  PointT<double> p_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> *__range2_1;
  int stepCount;
  BitMatrixCursorI c;
  Direction dir;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<ZXing::Direction> *__range2;
  BitMatrixCursorI curI;
  BitMatrixCursorF cur;
  RegressionLine *line;
  PointT<double> *in_stack_fffffffffffffda8;
  BitMatrixCursor<ZXing::PointT<int>_> *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined2 in_stack_fffffffffffffdbc;
  undefined1 in_stack_fffffffffffffdbe;
  undefined1 in_stack_fffffffffffffdbf;
  int in_stack_fffffffffffffdc0;
  Direction in_stack_fffffffffffffdc4;
  PointT<int> in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdd0;
  Direction in_stack_fffffffffffffdd4;
  double in_stack_fffffffffffffdd8;
  double in_stack_fffffffffffffde0;
  undefined1 backup;
  undefined1 *puVar7;
  RegressionLine *this_00;
  __normal_iterator<const_ZXing::PointT<double>_*,_std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>_>
  in_stack_fffffffffffffe58;
  double in_stack_fffffffffffffe60;
  RegressionLine *in_stack_fffffffffffffe68;
  int local_16c;
  RegressionLine *local_150;
  const_iterator local_130;
  Direction local_128 [2];
  initializer_list<ZXing::Direction> local_120;
  initializer_list<ZXing::Direction> *local_110;
  int local_104;
  int local_100;
  int local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  PointT<double> local_e8;
  PointT<int> local_d8;
  PointT<int> local_d0 [6];
  double local_a0;
  double local_98;
  undefined1 local_89;
  double local_88;
  double local_80;
  undefined1 local_60 [8];
  PointT<double> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_34;
  
  backup = (undefined1)((ulong)in_RSI >> 0x38);
  this_00 = in_RDI;
  local_34 = in_EDX;
  PVar5 = operator-<double,_double>
                    ((PointT<double> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  local_80 = PVar5.y;
  local_88 = PVar5.x;
  puVar7 = local_60;
  p_05.y = in_stack_fffffffffffffde0;
  p_05.x = in_stack_fffffffffffffdd8;
  PVar5.y._0_4_ = in_stack_fffffffffffffdd0;
  PVar5.x = (double)in_stack_fffffffffffffdc8;
  PVar5.y._4_4_ = in_stack_fffffffffffffdd4;
  BitMatrixCursor<ZXing::PointT<double>_>::BitMatrixCursor
            ((BitMatrixCursor<ZXing::PointT<double>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             (BitMatrix *)
             CONCAT17(in_stack_fffffffffffffdbf,
                      CONCAT16(in_stack_fffffffffffffdbe,
                               CONCAT24(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8))),p_05,
             PVar5);
  local_89 = 0;
  RegressionLine::RegressionLine
            ((RegressionLine *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  PVar5 = BitMatrixCursor<ZXing::PointT<double>_>::back
                    ((BitMatrixCursor<ZXing::PointT<double>_> *)0x2ef78a);
  local_98 = PVar5.y;
  local_a0 = PVar5.x;
  PVar6.y = in_stack_fffffffffffffde0;
  PVar6.x = in_stack_fffffffffffffdd8;
  RegressionLine::setDirectionInward
            ((RegressionLine *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),PVar6);
  BitMatrixCursor<ZXing::PointT<double>_>::stepToEdge
            ((BitMatrixCursor<ZXing::PointT<double>_> *)this_00,(int)((ulong)puVar7 >> 0x20),
             (int)puVar7,(bool)backup);
  if (local_34 == 3) {
    BitMatrixCursor<ZXing::PointT<double>_>::turnBack
              ((BitMatrixCursor<ZXing::PointT<double>_> *)
               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  }
  PointT<int>::PointT<double>(local_d0,&local_58);
  local_f8 = local_48;
  uStack_f0 = uStack_40;
  d_00.y = (double)in_stack_fffffffffffffdb0;
  d_00.x = (double)in_stack_fffffffffffffda8;
  PVar5 = mainDirection<double>(d_00);
  local_e8.y = PVar5.y;
  local_e8.x = PVar5.x;
  PointT<int>::PointT<double>(&local_d8,&local_e8);
  p_03.y = in_stack_fffffffffffffdd4;
  p_03.x = in_stack_fffffffffffffdd0;
  BitMatrixCursor<ZXing::PointT<int>_>::BitMatrixCursor
            ((BitMatrixCursor<ZXing::PointT<int>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             (BitMatrix *)
             CONCAT17(in_stack_fffffffffffffdbf,
                      CONCAT16(in_stack_fffffffffffffdbe,
                               CONCAT24(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8))),p_03,
             in_stack_fffffffffffffdc8);
  while( true ) {
    local_fc = (int)BitMatrixCursor<ZXing::PointT<int>_>::edgeAtBack
                              ((BitMatrixCursor<ZXing::PointT<int>_> *)
                               CONCAT17(in_stack_fffffffffffffdbf,
                                        CONCAT16(in_stack_fffffffffffffdbe,
                                                 CONCAT24(in_stack_fffffffffffffdbc,
                                                          in_stack_fffffffffffffdb8))));
    bVar2 = BitMatrixCursor::Value::operator_cast_to_bool((Value *)0x2ef8ee);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    local_100 = (int)BitMatrixCursor<ZXing::PointT<int>_>::edgeAtLeft
                               ((BitMatrixCursor<ZXing::PointT<int>_> *)
                                CONCAT17(in_stack_fffffffffffffdbf,
                                         CONCAT16(in_stack_fffffffffffffdbe,
                                                  CONCAT24(in_stack_fffffffffffffdbc,
                                                           in_stack_fffffffffffffdb8))));
    bVar2 = BitMatrixCursor::Value::operator_cast_to_bool((Value *)0x2ef91a);
    if (bVar2) {
      BitMatrixCursor<ZXing::PointT<int>_>::turnRight(in_stack_fffffffffffffdb0);
    }
    else {
      local_104 = (int)BitMatrixCursor<ZXing::PointT<int>_>::edgeAtRight
                                 ((BitMatrixCursor<ZXing::PointT<int>_> *)
                                  CONCAT17(in_stack_fffffffffffffdbf,
                                           CONCAT16(in_stack_fffffffffffffdbe,
                                                    CONCAT24(in_stack_fffffffffffffdbc,
                                                             in_stack_fffffffffffffdb8))));
      bVar2 = BitMatrixCursor::Value::operator_cast_to_bool((Value *)0x2ef950);
      if (bVar2) {
        BitMatrixCursor<ZXing::PointT<int>_>::turnLeft(in_stack_fffffffffffffdb0);
      }
      else {
        BitMatrixCursor<ZXing::PointT<int>_>::step
                  ((BitMatrixCursor<ZXing::PointT<int>_> *)
                   CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                   CONCAT13(in_stack_fffffffffffffdbf,
                            CONCAT12(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdbc)));
      }
    }
  }
  local_128[0] = LEFT;
  local_128[1] = 1;
  local_120._M_array = local_128;
  local_120._M_len = 2;
  local_110 = &local_120;
  local_130 = std::initializer_list<ZXing::Direction>::begin(local_110);
  pDVar3 = std::initializer_list<ZXing::Direction>::end
                     ((initializer_list<ZXing::Direction> *)in_stack_fffffffffffffdb0);
  for (; local_130 != pDVar3; local_130 = local_130 + 1) {
    BitMatrixCursor<ZXing::PointT<int>_>::direction
              ((BitMatrixCursor<ZXing::PointT<int>_> *)in_stack_fffffffffffffdc8,
               in_stack_fffffffffffffdc4);
    p_04.y = in_stack_fffffffffffffdd4;
    p_04.x = in_stack_fffffffffffffdd0;
    BitMatrixCursor<ZXing::PointT<int>_>::BitMatrixCursor
              ((BitMatrixCursor<ZXing::PointT<int>_> *)
               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               (BitMatrix *)
               CONCAT17(in_stack_fffffffffffffdbf,
                        CONCAT16(in_stack_fffffffffffffdbe,
                                 CONCAT24(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8))),
               p_04,in_stack_fffffffffffffdc8);
    PVar5 = operator-<double,_double>
                      ((PointT<double> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    this = (BitMatrixCursor<ZXing::PointT<int>_> *)PVar5.y;
    p_00.x._4_2_ = in_stack_fffffffffffffdbc;
    p_00.x._0_4_ = in_stack_fffffffffffffdb8;
    p_00.x._6_1_ = in_stack_fffffffffffffdbe;
    p_00.x._7_1_ = in_stack_fffffffffffffdbf;
    p_00.y._0_4_ = in_stack_fffffffffffffdc0;
    p_00.y._4_4_ = in_stack_fffffffffffffdc4;
    dVar1 = maxAbsComponent<double>(p_00);
    in_stack_fffffffffffffdd0 = SUB84(dVar1,0);
    in_stack_fffffffffffffdd4 = (Direction)((ulong)dVar1 >> 0x20);
    local_16c = (int)dVar1;
    do {
      p_01.y = in_stack_fffffffffffffdc4;
      p_01.x = in_stack_fffffffffffffdc0;
      in_stack_fffffffffffffe68 = local_150;
      PVar6 = centered(p_01);
      in_stack_fffffffffffffdc0 = PVar6.y._0_4_;
      in_stack_fffffffffffffdc4 = PVar6.y._4_4_;
      in_stack_fffffffffffffdc8 = (PointT<int>)PVar6.x;
      p_02.y._0_4_ = in_stack_fffffffffffffdd0;
      p_02.x = (double)in_stack_fffffffffffffdc8;
      p_02.y._4_4_ = in_stack_fffffffffffffdd4;
      RegressionLine::add((RegressionLine *)PVar6.y,p_02);
      local_16c = local_16c + -1;
      bVar2 = false;
      if (0 < local_16c) {
        in_stack_fffffffffffffdbe =
             BitMatrixCursor<ZXing::PointT<int>_>::stepAlongEdge
                       (this,in_stack_fffffffffffffdd4,
                        SUB41((uint)in_stack_fffffffffffffdd0 >> 0x18,0));
        bVar2 = (bool)in_stack_fffffffffffffdbe;
      }
    } while (bVar2 != false);
    in_stack_fffffffffffffdbf = 0;
  }
  RegressionLine::evaluate
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
             SUB81((ulong)in_stack_fffffffffffffe58._M_current >> 0x38,0));
  __lhs = RegressionLine::points(this_00);
  std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::begin
            ((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> *)
             in_stack_fffffffffffffda8);
  std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::end
            ((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> *)
             in_stack_fffffffffffffda8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_ZXing::PointT<double>_*,_std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>_>
                             *)__lhs,(__normal_iterator<const_ZXing::PointT<double>_*,_std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>_>
                                      *)in_stack_fffffffffffffda8), bVar2) {
    pPVar4 = __gnu_cxx::
             __normal_iterator<const_ZXing::PointT<double>_*,_std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>_>
             ::operator*((__normal_iterator<const_ZXing::PointT<double>_*,_std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>_>
                          *)&stack0xfffffffffffffe58);
    log<double>(*pPVar4,2);
    __gnu_cxx::
    __normal_iterator<const_ZXing::PointT<double>_*,_std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>_>
    ::operator++((__normal_iterator<const_ZXing::PointT<double>_*,_std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>_>
                  *)&stack0xfffffffffffffe58);
  }
  return in_RDI;
}

Assistant:

static RegressionLine TraceLine(const BitMatrix& image, PointF p, PointF d, int edge)
{
	BitMatrixCursorF cur(image, p, d - p);
	RegressionLine line;
	line.setDirectionInward(cur.back());

	// collect points inside the black line -> backup on 3rd edge
	cur.stepToEdge(edge, 0, edge == 3);
	if (edge == 3)
		cur.turnBack();

	auto curI = BitMatrixCursorI(image, PointI(cur.p), PointI(mainDirection(cur.d)));
	// make sure curI positioned such that the white->black edge is directly behind
	// Test image: fix-traceline.jpg
	while (!curI.edgeAtBack()) {
		if (curI.edgeAtLeft())
			curI.turnRight();
		else if (curI.edgeAtRight())
			curI.turnLeft();
		else
			curI.step(-1);
	}

	for (auto dir : {Direction::LEFT, Direction::RIGHT}) {
		auto c = BitMatrixCursorI(image, curI.p, curI.direction(dir));
		auto stepCount = static_cast<int>(maxAbsComponent(cur.p - p));
		do {
			line.add(centered(c.p));
		} while (--stepCount > 0 && c.stepAlongEdge(dir, true));
	}

	line.evaluate(1.0, true);

	for (auto p : line.points())
		log(p, 2);

	return line;
}